

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O2

int64_t get_sse(AV1_COMP *cpi,MACROBLOCK *x,int64_t *sse_y)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  uint sse;
  uint local_54;
  ulong *local_50;
  MB_MODE_INFO *local_48;
  AV1_COMP *local_40;
  long local_38;
  
  local_48 = *(x->e_mbd).mi;
  local_38 = 0x88;
  if (((cpi->common).seq_params)->monochrome == '\0') {
    local_38 = 0x198;
  }
  piVar1 = &(x->e_mbd).plane[0].subsampling_x;
  lVar3 = 0;
  lVar2 = 0;
  local_50 = (ulong *)sse_y;
  local_40 = cpi;
  while ((local_38 != lVar3 && ((lVar3 == 0 || ((x->e_mbd).is_chroma_ref == true))))) {
    bVar4 = local_50 != (ulong *)0x0;
    (*local_40->ppi->fn_ptr[av1_ss_size_lookup[local_48->bsize][*piVar1][piVar1[1]]].vf)
              (*(uint8_t **)((long)&x->plane[0].src.buf + lVar3),
               *(int *)((long)&x->plane[0].src.stride + lVar3),((buf_2d *)(piVar1 + 3))->buf,
               piVar1[9],&local_54);
    if (bVar4 && lVar3 == 0) {
      *local_50 = (ulong)local_54;
    }
    lVar2 = lVar2 + (ulong)local_54;
    lVar3 = lVar3 + 0x88;
    piVar1 = piVar1 + 0x28c;
  }
  return lVar2 << 4;
}

Assistant:

static int64_t get_sse(const AV1_COMP *cpi, const MACROBLOCK *x,
                       int64_t *sse_y) {
  const AV1_COMMON *cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  const MACROBLOCKD *xd = &x->e_mbd;
  const MB_MODE_INFO *mbmi = xd->mi[0];
  int64_t total_sse = 0;
  for (int plane = 0; plane < num_planes; ++plane) {
    if (plane && !xd->is_chroma_ref) break;
    const struct macroblock_plane *const p = &x->plane[plane];
    const struct macroblockd_plane *const pd = &xd->plane[plane];
    const BLOCK_SIZE bs =
        get_plane_block_size(mbmi->bsize, pd->subsampling_x, pd->subsampling_y);
    unsigned int sse;

    cpi->ppi->fn_ptr[bs].vf(p->src.buf, p->src.stride, pd->dst.buf,
                            pd->dst.stride, &sse);
    total_sse += sse;
    if (!plane && sse_y) *sse_y = sse;
  }
  total_sse <<= 4;
  return total_sse;
}